

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O1

BOOL __thiscall
Js::TypedArrayBase::GetDiagValueString
          (TypedArrayBase *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  charcount_t countNeeded;
  char16 *str;
  JavascriptString *local_30;
  JavascriptString *toStringResult;
  
  EnterPinnedScope(&local_30);
  local_30 = (JavascriptString *)JavascriptObject::ToStringHelper(this,requestContext);
  str = JavascriptString::GetString(local_30);
  countNeeded = JavascriptString::GetLength(local_30);
  StringBuilder<Memory::ArenaAllocator>::EnsureBuffer(stringBuilder,countNeeded);
  JavascriptString::CopyHelper(stringBuilder->appendPtr,str,countNeeded);
  stringBuilder->appendPtr = stringBuilder->appendPtr + countNeeded;
  stringBuilder->count = stringBuilder->count + countNeeded;
  LeavePinnedScope();
  return 1;
}

Assistant:

BOOL TypedArrayBase::GetDiagValueString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        ENTER_PINNED_SCOPE(JavascriptString, toStringResult);
        toStringResult = JavascriptObject::ToStringInternal(this, requestContext);
        stringBuilder->Append(toStringResult->GetString(), toStringResult->GetLength());
        LEAVE_PINNED_SCOPE();
        return TRUE;
    }